

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O0

void __thiscall QEvdevKeyboardManager::~QEvdevKeyboardManager(QEvdevKeyboardManager *this)

{
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_001a87c8;
  QString::~QString((QString *)0x13293e);
  QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::~DeviceHandlerList
            ((DeviceHandlerList<QEvdevKeyboardHandler> *)0x13294c);
  QString::~QString((QString *)0x13295a);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

QEvdevKeyboardManager::~QEvdevKeyboardManager()
{
}